

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ct.cpp
# Opt level: O3

void UConverter_fromUnicode_CompoundText_OFFSETS(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  UBool useFallback;
  char cVar1;
  UChar UVar2;
  UConverter *pUVar3;
  uint8_t *puVar4;
  UChar *pUVar5;
  UConverter *pUVar6;
  uint uVar7;
  int32_t iVar8;
  ulong uVar9;
  int iVar10;
  uint8_t uVar11;
  uint uVar12;
  uint8_t *puVar13;
  uint uVar14;
  ulong uVar15;
  UChar *pUVar16;
  int iVar17;
  uint8_t *puVar18;
  undefined4 uVar19;
  uint8_t *puVar20;
  long lVar21;
  uint uVar22;
  uint32_t pValue;
  uint8_t tmpTargetBuffer [7];
  ulong local_50;
  uint local_44;
  uint8_t auStack_3f [7];
  void *local_38;
  
  pUVar3 = args->converter;
  pUVar16 = args->source;
  puVar20 = (uint8_t *)args->target;
  puVar4 = (uint8_t *)args->targetLimit;
  pUVar5 = args->sourceLimit;
  useFallback = pUVar3->useFallback;
  local_38 = pUVar3->extraInfo;
  local_50 = (ulong)*(uint *)((long)pUVar3->extraInfo + 0xa0);
  uVar22 = pUVar3->fromUChar32;
  puVar18 = puVar20;
  if (uVar22 != 0 && puVar20 < puVar4) goto LAB_002b05d1;
  do {
    uVar19 = (undefined4)local_50;
    if (pUVar5 <= pUVar16) {
LAB_002b09c3:
      *(undefined4 *)((long)local_38 + 0xa0) = uVar19;
      args->source = pUVar16;
      args->target = (char *)puVar20;
      return;
    }
    if (puVar4 <= puVar20) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_002b09c3;
    }
    UVar2 = *pUVar16;
    uVar22 = (uint)(ushort)UVar2;
    pUVar16 = pUVar16 + 1;
    puVar18 = puVar20;
    if ((uVar22 & 0xf800) == 0xd800) {
      if (((ushort)UVar2 >> 10 & 1) == 0) {
LAB_002b05d1:
        uVar19 = (undefined4)local_50;
        puVar20 = puVar18;
        if (pUVar16 < pUVar5) {
          UVar2 = *pUVar16;
          if (((ushort)UVar2 & 0xfc00) == 0xdc00) {
            pUVar16 = pUVar16 + 1;
            uVar22 = uVar22 * 0x400 + (uint)(ushort)UVar2 + 0xfca02400;
            pUVar3->fromUChar32 = 0;
            goto LAB_002b060c;
          }
          goto LAB_002b09b1;
        }
      }
      else {
LAB_002b09b1:
        *err = U_ILLEGAL_CHAR_FOUND;
        puVar20 = puVar18;
      }
      pUVar3->fromUChar32 = uVar22;
      goto LAB_002b09c3;
    }
LAB_002b060c:
    uVar7 = 0;
    if ((((10 < uVar22) || ((0x601U >> (uVar22 & 0x1f) & 1) == 0)) &&
        (0x5f < (uVar22 & 0xffffff60) - 0x20)) &&
       ((0xf < uVar22 - 0x102 || (uVar7 = 0x10, (0xfc3fU >> (uVar22 - 0x102 & 0x1f) & 1) == 0)))) {
      uVar12 = uVar22 & 0xfffffffc;
      uVar7 = 0x10;
      if (((uVar12 != 0x118) && (1 < (uVar22 & 0xfffffffb) - 0x139)) &&
         ((((0x14 < uVar22 - 0x141 || ((0x19804fU >> (uVar22 - 0x141 & 0x1f) & 1) == 0)) &&
           (uVar14 = uVar22 & 0xfffffffe, uVar14 != 0x15e && uVar12 != 0x158)) &&
          (((0x1e < uVar22 - 0x160 || ((0x7e03c03fU >> (uVar22 - 0x160 & 0x1f) & 1) == 0)) &&
           (((0x16 < uVar22 - 0x2c7 || ((0x560001U >> (uVar22 - 0x2c7 & 0x1f) & 1) == 0)) &&
            (uVar7 = 0x11, uVar12 != 0x108)))))))) {
        if (uVar22 - 0x11c < 6) {
          if (uVar12 != 0x124 && (0x33U >> ((byte)(uVar22 - 0x11c) & 0x1f) & 1) == 0) {
LAB_002b09f4:
            if (((0x39 < uVar22 - 0x134) ||
                ((0x300030000000003U >> ((ulong)(uVar22 - 0x134) & 0x3f) & 1) == 0)) &&
               (uVar7 = 0x12, uVar12 != 0x174)) {
              if ((int)uVar22 < 0x1e56) {
                if ((0x37 < uVar22 - 0x1e0a) ||
                   ((0xc0000000300003U >> ((ulong)(uVar22 - 0x1e0a) & 0x3f) & 1) == 0)) {
                  if ((0x26 < uVar22 - 0x152) ||
                     ((0x4000000003U >> ((ulong)(uVar22 - 0x152) & 0x3f) & 1) == 0))
                  goto LAB_002b0ac1;
LAB_002b0ab1:
                  uVar7 = 0x13;
                }
              }
              else if (((0x2f < uVar22 - 0x1e56) ||
                       ((0xfc0000300c03U >> ((ulong)(uVar22 - 0x1e56) & 0x3f) & 1) == 0)) &&
                      (1 < uVar22 - 0x1ef2)) {
                if (uVar22 == 0x20ac) goto LAB_002b0ab1;
LAB_002b0ac1:
                uVar7 = 0xf;
                if (0x1c < uVar22 - 0xe3f && 0x39 < uVar22 - 0xe01) {
                  uVar7 = 0xe;
                  if (((((0x23 < uVar22 - 0x100) ||
                        ((0xc00cc0003U >> ((ulong)(uVar22 - 0x100) & 0x3f) & 1) == 0)) &&
                       (uVar14 != 0x12e && uVar12 != 0x128)) &&
                      ((0x3d < uVar22 - 0x136 ||
                       ((0x303f000300f18067U >> ((ulong)(uVar22 - 0x136) & 0x3f) & 1) == 0)))) &&
                     ((uVar7 = 2, uVar14 != 700 && (uVar22 != 0x2015 && 0x4a < uVar22 - 900)))) {
                    uVar7 = 3;
                    if (((0x13 < uVar22 - 0x60c) || ((0x88001U >> (uVar22 - 0x60c & 0x1f) & 1) == 0)
                        ) && ((0x12 < uVar22 - 0x640 && 0x19 < uVar22 - 0x621 &&
                              (uVar22 != 0x200b && 0xd < uVar22 - 0x660)))) {
                      if (uVar22 - 0xfe70 < 5) {
                        if ((0x48 < uVar22 - 0xfe76 &
                            (0x17U >> ((byte)(uVar22 - 0xfe70) & 0x1f) ^ 1)) != 0) {
LAB_002b0cf7:
                          uVar7 = 0xd;
                          if ((((0x1a < uVar22 - 0x5d0) && (uVar22 != 0x2017)) && (uVar22 != 0x203e)
                              ) && (uVar7 = 0xc, uVar22 != 0x2116 && 0x5e < uVar22 - 0x401)) {
                            uVar7 = 1;
                            if (((0x13 < uVar22 - 0x11e) ||
                                ((0xc0003U >> (uVar22 - 0x11e & 0x1f) & 1) == 0)) &&
                               (uVar15 = 0, uVar12 != 0x218)) goto LAB_002b0679;
                          }
                        }
                      }
                      else if (0x48 < uVar22 - 0xfe76) goto LAB_002b0cf7;
                    }
                  }
                }
              }
            }
          }
        }
        else if (uVar12 != 0x124) goto LAB_002b09f4;
      }
    }
    uVar15 = 0;
    if ((uint)local_50 != uVar7) {
      uVar11 = escSeqCompoundText[uVar7][0];
      uVar15 = 0;
      do {
        auStack_3f[uVar15] = uVar11;
        uVar11 = *(uint8_t *)((ulong)uVar7 * 5 + 0x35bad1 + uVar15);
        uVar15 = uVar15 + 1;
      } while (uVar11 != '\0');
      local_50 = (ulong)uVar7;
    }
    iVar10 = (int)local_50;
    if (iVar10 == 0) {
      uVar9 = uVar15 & 0xffffffff;
      uVar15 = (ulong)((int)uVar15 + 1);
      auStack_3f[uVar9] = (uint8_t)uVar22;
    }
    else {
      if (iVar10 == -1) {
LAB_002b0679:
        puVar20 = escSeqCompoundText[1] + 1;
        lVar21 = 0;
LAB_002b068d:
        iVar8 = ucnv_MBCSFromUChar32_63
                          (*(UConverterSharedData **)((long)local_38 + lVar21 * 8 + 8),uVar22,
                           &local_44,useFallback);
        if (iVar8 < 1) break;
        if ((int)local_50 + -1 != (int)lVar21) {
          uVar11 = (*(uint8_t (*) [5])(puVar20 + -1))[0];
          puVar13 = auStack_3f + (uVar15 & 0xffffffff);
          do {
            *puVar13 = uVar11;
            uVar11 = *puVar20;
            puVar13 = puVar13 + 1;
            uVar15 = (ulong)((int)uVar15 + 1);
            puVar20 = puVar20 + 1;
          } while (uVar11 != '\0');
          local_50 = lVar21 + 1U & 0xffffffff;
        }
        puVar20 = auStack_3f + (int)uVar15;
        iVar17 = iVar8 + 1;
        iVar10 = iVar8 * 8;
        do {
          iVar10 = iVar10 + -8;
          *puVar20 = (uint8_t)(local_44 >> ((byte)iVar10 & 0x1f));
          puVar20 = puVar20 + 1;
          uVar15 = (ulong)((int)uVar15 + 1);
          iVar17 = iVar17 + -1;
        } while (1 < iVar17);
        goto LAB_002b092d;
      }
      iVar8 = ucnv_MBCSFromUChar32_63
                        (*(UConverterSharedData **)((long)local_38 + (long)iVar10 * 8),uVar22,
                         &local_44,useFallback);
      if (0 < iVar8) {
        puVar20 = auStack_3f + (uVar15 & 0xffffffff);
        uVar22 = iVar8 + 1;
        iVar10 = iVar8 * 8;
        uVar15 = (ulong)(uint)((int)uVar15 + iVar8);
        do {
          iVar10 = iVar10 + -8;
          *puVar20 = (uint8_t)(local_44 >> ((byte)iVar10 & 0x1f));
          puVar20 = puVar20 + 1;
          uVar22 = uVar22 - 1;
        } while (1 < uVar22);
      }
    }
LAB_002b092d:
    uVar9 = 0;
    puVar20 = puVar18;
    if (0 < (int)uVar15) {
      uVar9 = 0;
      do {
        puVar20 = puVar18 + uVar9;
        if (puVar4 <= puVar20) {
          *err = U_BUFFER_OVERFLOW_ERROR;
          goto LAB_002b0969;
        }
        *puVar20 = auStack_3f[uVar9];
        uVar9 = uVar9 + 1;
      } while ((uVar15 & 0xffffffff) != uVar9);
      puVar20 = puVar18 + uVar9;
      uVar9 = uVar15 & 0xffffffff;
    }
    if (*err == U_BUFFER_OVERFLOW_ERROR) {
LAB_002b0969:
      if ((int)uVar9 < (int)uVar15) {
        uVar9 = uVar9 & 0xffffffff;
        do {
          uVar11 = auStack_3f[uVar9];
          pUVar6 = args->converter;
          cVar1 = pUVar6->charErrorBufferLength;
          pUVar6->charErrorBufferLength = cVar1 + '\x01';
          pUVar6->charErrorBuffer[cVar1] = uVar11;
          uVar9 = uVar9 + 1;
        } while ((uVar15 & 0xffffffff) != uVar9);
      }
    }
  } while( true );
  puVar20 = puVar20 + 5;
  lVar21 = lVar21 + 1;
  if (lVar21 == 0xb) goto LAB_002b092d;
  goto LAB_002b068d;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_CompoundText_OFFSETS(UConverterFromUnicodeArgs* args, UErrorCode* err){
    UConverter *cnv = args->converter;
    uint8_t *target = (uint8_t *) args->target;
    const uint8_t *targetLimit = (const uint8_t *) args->targetLimit;
    const UChar* source = args->source;
    const UChar* sourceLimit = args->sourceLimit;
    /* int32_t* offsets = args->offsets; */
    UChar32 sourceChar;
    UBool useFallback = cnv->useFallback;
    uint8_t tmpTargetBuffer[7];
    int32_t tmpTargetBufferLength = 0;
    COMPOUND_TEXT_CONVERTERS currentState, tmpState;
    uint32_t pValue;
    int32_t pValueLength = 0;
    int32_t i, n, j;

    UConverterDataCompoundText *myConverterData = (UConverterDataCompoundText *) cnv->extraInfo;

    currentState = myConverterData->state;

    /* check if the last codepoint of previous buffer was a lead surrogate*/
    if((sourceChar = cnv->fromUChar32)!=0 && target< targetLimit) {
        goto getTrail;
    }

    while( source < sourceLimit){
        if(target < targetLimit){

            sourceChar  = *(source++);
            /*check if the char is a First surrogate*/
             if(U16_IS_SURROGATE(sourceChar)) {
                if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if(source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail=(UChar) *source;
                        if(U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            cnv->fromUChar32=0x00;
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                            cnv->fromUChar32=sourceChar;
                            break;
                        }
                    } else {
                        /* no more input */
                        cnv->fromUChar32=sourceChar;
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

             tmpTargetBufferLength = 0;
             tmpState = getState(sourceChar);

             if (tmpState != DO_SEARCH && currentState != tmpState) {
                 /* Get escape sequence if necessary */
                 currentState = tmpState;
                 for (i = 0; escSeqCompoundText[currentState][i] != 0; i++) {
                     tmpTargetBuffer[tmpTargetBufferLength++] = escSeqCompoundText[currentState][i];
                 }
             }

             if (tmpState == DO_SEARCH) {
                 /* Test all available converters */
                 for (i = 1; i < SEARCH_LENGTH; i++) {
                     pValueLength = ucnv_MBCSFromUChar32(myConverterData->myConverterArray[i], sourceChar, &pValue, useFallback);
                     if (pValueLength > 0) {
                         tmpState = (COMPOUND_TEXT_CONVERTERS)i;
                         if (currentState != tmpState) {
                             currentState = tmpState;
                             for (j = 0; escSeqCompoundText[currentState][j] != 0; j++) {
                                 tmpTargetBuffer[tmpTargetBufferLength++] = escSeqCompoundText[currentState][j];
                             }
                         }
                         for (n = (pValueLength - 1); n >= 0; n--) {
                             tmpTargetBuffer[tmpTargetBufferLength++] = (uint8_t)(pValue >> (n * 8));
                         }
                         break;
                     }
                 }
             } else if (tmpState == COMPOUND_TEXT_SINGLE_0) {
                 tmpTargetBuffer[tmpTargetBufferLength++] = (uint8_t)sourceChar;
             } else {
                 pValueLength = ucnv_MBCSFromUChar32(myConverterData->myConverterArray[currentState], sourceChar, &pValue, useFallback);
                 if (pValueLength > 0) {
                     for (n = (pValueLength - 1); n >= 0; n--) {
                         tmpTargetBuffer[tmpTargetBufferLength++] = (uint8_t)(pValue >> (n * 8));
                     }
                 }
             }

             for (i = 0; i < tmpTargetBufferLength; i++) {
                 if (target < targetLimit) {
                     *target++ = tmpTargetBuffer[i];
                 } else {
                     *err = U_BUFFER_OVERFLOW_ERROR;
                     break;
                 }
             }

             if (*err == U_BUFFER_OVERFLOW_ERROR) {
                 for (; i < tmpTargetBufferLength; i++) {
                     args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = tmpTargetBuffer[i];
                 }
             }
        } else {
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*save the state and return */
    myConverterData->state = currentState;
    args->source = source;
    args->target = (char*)target;
}